

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<ThreadContext::CollectCallBack,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<ThreadContext::CollectCallBack,_RealCount> *this,HeapAllocator *allocator,
          CollectCallBack *element)

{
  DListNodeBase<ThreadContext::CollectCallBack> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNode<ThreadContext::CollectCallBack> *obj;
  
  obj = (DListNode<ThreadContext::CollectCallBack> *)(element + -1);
  bVar3 = HasNode(this,(NodeBase *)obj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar1 = (obj->super_DListNodeBase<ThreadContext::CollectCallBack>).next.base;
  *(DListNodeBase<ThreadContext::CollectCallBack> **)element[-1].context = pDVar1;
  pDVar1->prev = (anon_union_8_3_7fb8a913_for_prev)element[-1].context;
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<ThreadContext::CollectCallBack>>
            (allocator,obj);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }